

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O2

bool CommandDrawSwitchableImage::EvaluateOperation(Operator *op,int *value,int *compare)

{
  int iVar1;
  int iVar2;
  
  iVar1 = *compare;
  iVar2 = *value;
  switch(*op) {
  case EQUAL:
    return iVar1 == iVar2;
  case LESS:
    return iVar1 < iVar2;
  default:
    return iVar2 < iVar1;
  case LESSOREQUAL:
    return iVar1 <= iVar2;
  case GREATEROREQUAL:
    return iVar2 <= iVar1;
  case NOTEQUAL:
    return iVar1 != iVar2;
  }
}

Assistant:

static bool	EvaluateOperation(const Operator &op, const int &value, const int &compare)
		{
			switch(op)
			{
				case EQUAL:
					return compare == value;
				case LESS:
					return compare < value;
				case GREATER:
				default:
					return compare > value;
				case LESSOREQUAL:
					return compare <= value;
				case GREATEROREQUAL:
					return compare >= value;
				case NOTEQUAL:
					return compare != value;
			}
		}